

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

protobuf_test_messages_proto3_TestAllTypesProto3 *
upb_test_mutable_optional_msg_ext(upb_test_TestExtensions *msg,upb_Arena *arena)

{
  protobuf_test_messages_proto3_TestAllTypesProto3 *local_20;
  protobuf_test_messages_proto3_TestAllTypesProto3 *sub;
  upb_Arena *arena_local;
  upb_test_TestExtensions *msg_local;
  
  local_20 = upb_test_optional_msg_ext(msg);
  if ((local_20 == (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0) &&
     (local_20 = (protobuf_test_messages_proto3_TestAllTypesProto3 *)
                 _upb_Message_New(&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init,
                                  arena),
     local_20 != (protobuf_test_messages_proto3_TestAllTypesProto3 *)0x0)) {
    upb_test_set_optional_msg_ext(msg,local_20,arena);
  }
  return local_20;
}

Assistant:

UPB_INLINE struct protobuf_test_messages_proto3_TestAllTypesProto3* upb_test_mutable_optional_msg_ext(struct upb_test_TestExtensions* msg,
                                    upb_Arena* arena) {
  struct protobuf_test_messages_proto3_TestAllTypesProto3* sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)upb_test_optional_msg_ext(msg);
  if (sub == NULL) {
    sub = (struct protobuf_test_messages_proto3_TestAllTypesProto3*)_upb_Message_New(&protobuf_0test_0messages__proto3__TestAllTypesProto3_msg_init, arena);
    if (sub) upb_test_set_optional_msg_ext(msg, sub, arena);
  }
  return sub;
}